

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O1

void SstInternalProvideTimestep
               (SstStream Stream,SstData LocalMetadata,SstData Data,ssize_t Timestep,
               FFSFormatList Formats,DataFreeFunc FreeTimestep,void *FreeClientData,
               SstData AttributeData,DataFreeFunc FreeAttributeData,void *FreeAttributelientData)

{
  FFSFormatBlock **ppFVar1;
  size_t *psVar2;
  pthread_mutex_t *__mutex;
  undefined8 *puVar3;
  StreamStatus SVar4;
  WS_ReaderInfo *pp_Var5;
  undefined4 *puVar6;
  CP_DP_WSR_ReadPatternLockedFunc p_Var7;
  size_t sVar8;
  StepRequest __ptr;
  SstData p_Var9;
  SstPreloadModeType SVar10;
  ssize_t sVar11;
  FFSFormatList tmp;
  _TimestepMetadataMsg *RS_StreamPtr;
  CPTimestepList Entry;
  FFSFormatBlock *pFVar12;
  void **ppvVar13;
  ReturnMetadataInfo Metadata;
  FFSFormatList pFVar14;
  undefined4 *puVar15;
  void *pvVar16;
  WS_ReaderInfo p_Var17;
  ulong uVar18;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  WS_ReaderInfo extraout_RDX;
  WS_ReaderInfo extraout_RDX_00;
  uint uVar19;
  int iVar20;
  int iVar21;
  RegisterQueue p_Var22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  void *DP_TimestepInfo;
  void *data_block2;
  void *data_block1;
  _MetadataPlusDPInfo Md;
  undefined8 local_e8;
  ssize_t sStack_e0;
  ssize_t local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  _SstData *p_Stack_c0;
  _SstData *local_b8;
  void *pvStack_b0;
  ulong local_a8;
  _ReleaseRec *p_Stack_a0;
  undefined8 local_98;
  _ReleaseRec *p_Stack_90;
  ulong local_88;
  void *pvStack_80;
  void **local_70;
  void *local_68;
  void *local_60;
  void *local_58;
  SstData local_50;
  SstData local_48;
  FFSFormatList local_40;
  void *local_38;
  
  RS_StreamPtr = (_TimestepMetadataMsg *)malloc(0x38);
  local_68 = (void *)0x0;
  Entry = (CPTimestepList)calloc(1,0x70);
  RS_StreamPtr->RS_Stream = (void *)0x0;
  RS_StreamPtr->Timestep = 0;
  RS_StreamPtr->CohortSize = 0;
  RS_StreamPtr->PreloadMode = SstPreloadNone;
  RS_StreamPtr->Formats = (FFSFormatList)0x0;
  RS_StreamPtr->Metadata = (SstData)0x0;
  RS_StreamPtr->AttributeData = (SstData)0x0;
  RS_StreamPtr->DP_TimestepInfo = (void **)0x0;
  __mutex = &Stream->DataLock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  Stream->WriterTimestep = Timestep;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  (*Stream->DP_Interface->provideTimestep)
            (&Svcs,Stream->DP_Stream,Data,LocalMetadata,Timestep,&local_68);
  pFVar12 = Formats;
  if (Formats != (FFSFormatList)0x0) {
    do {
      ppFVar1 = &pFVar12->Next;
      pFVar12 = *ppFVar1;
    } while (*ppFVar1 != (FFSFormatBlock *)0x0);
  }
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  local_48 = AttributeData;
  local_38 = local_68;
  local_50 = LocalMetadata;
  local_40 = Formats;
  if ((Data != (SstData)0x0) && (_perfstubs_initialized == 1)) {
    if (SstInternalProvideTimestep::__var2102 == (void *)0x0) {
      SstInternalProvideTimestep::__var2102 = (void *)ps_create_counter_("Timestep local data size")
      ;
    }
    ps_sample_counter_(SUB84(((double)CONCAT44(0x45300000,(int)(Data->DataSize >> 0x20)) -
                             1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)Data->DataSize) - 4503599627370496.0)
                             ,0),SstInternalProvideTimestep::__var2102);
  }
  if ((LocalMetadata != (SstData)0x0) && (_perfstubs_initialized == 1)) {
    if (SstInternalProvideTimestep::__var2106 == (void *)0x0) {
      SstInternalProvideTimestep::__var2106 =
           (void *)ps_create_counter_("Timestep local metadata size");
    }
    ps_sample_counter_(SUB84(((double)CONCAT44(0x45300000,(int)(LocalMetadata->DataSize >> 0x20)) -
                             1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)LocalMetadata->DataSize) -
                             4503599627370496.0),0),SstInternalProvideTimestep::__var2106);
  }
  Stream->LastProvidedTimestep = Timestep;
  if ((Timestep == 0) && (Stream->ConfigParams->FirstTimestepPrecious != 0)) {
    Entry->PreciousTimestep = 1;
  }
  Entry->ReferenceCount = 1;
  Entry->DPRegistered = 1;
  Entry->Timestep = Timestep;
  Entry->Msg = RS_StreamPtr;
  Entry->MetadataArray = RS_StreamPtr->Metadata;
  Entry->DP_TimestepInfo = RS_StreamPtr->DP_TimestepInfo;
  Entry->FreeTimestep = FreeTimestep;
  Entry->FreeClientData = FreeClientData;
  Entry->Next = Stream->QueuedTimesteps;
  Entry->InProgressFlag = 1;
  Stream->QueuedTimesteps = Entry;
  Stream->QueuedTimestepCount = Stream->QueuedTimestepCount + 1;
  psVar2 = &(Stream->Stats).TimestepsCreated;
  *psVar2 = *psVar2 + 1;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (_perfstubs_initialized == 1) {
    if (SstInternalProvideTimestep::timerMD == (void *)0x0) {
      SstInternalProvideTimestep::timerMD =
           (void *)ps_timer_create_("Metadata Consolidation time in EndStep()");
    }
    ps_timer_start_(SstInternalProvideTimestep::timerMD);
  }
  ppvVar13 = CP_consolidateDataToRankZero
                       (Stream,&local_50,Stream->CPInfo->PerRankMetadataFormat,&local_58);
  if (Stream->Rank == 0) {
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    p_Var22 = Stream->ReaderRegisterQueue;
    QueueMaintenance(Stream);
    if (Stream->QueueFullPolicy == SstQueueFullDiscard) {
      CP_verbose(Stream,TraceVerbose,
                 "Testing Discard Condition, Queued Timestep Count %d, QueueLimit %d\n",
                 (ulong)(uint)Stream->QueuedTimestepCount,(ulong)(uint)Stream->QueueLimit);
      QueueMaintenance(Stream);
      uVar19 = (uint)(Stream->QueueLimit < Stream->QueuedTimestepCount);
    }
    else {
      iVar21 = Stream->QueueLimit;
      if (iVar21 < 1) {
LAB_0011158c:
        uVar19 = 0;
      }
      else {
        uVar19 = 0;
        do {
          if (Stream->QueuedTimestepCount <= iVar21) goto LAB_0011158c;
          CP_verbose(Stream,PerStepVerbose,"Blocking on QueueFull condition\n");
          pthread_cond_wait((pthread_cond_t *)&Stream->DataCondition,(pthread_mutex_t *)__mutex);
          iVar21 = Stream->QueueLimit;
        } while (0 < iVar21);
      }
    }
    pvStack_80 = (void *)0x0;
    local_98 = 0;
    local_b8 = (_SstData *)0x0;
    pvStack_b0 = (void *)0x0;
    local_c8 = 0;
    p_Stack_c0 = (_SstData *)0x0;
    local_d8 = 0;
    uStack_d0 = 0;
    local_e8._4_4_ = 0;
    sStack_e0 = 0;
    if (p_Var22 != (RegisterQueue)0x0) {
      local_e8._4_4_ = 0;
      do {
        local_e8._4_4_ = local_e8._4_4_ + 1;
        p_Var22 = p_Var22->Next;
      } while (p_Var22 != (_RegisterQueue *)0x0);
    }
    local_e8 = CONCAT44(local_e8._4_4_,uVar19);
    local_a8 = (ulong)(uint)Stream->ReleaseCount;
    p_Stack_a0 = Stream->ReleaseList;
    local_88 = (ulong)(uint)Stream->LockDefnsCount;
    p_Stack_90 = Stream->LockDefnsList;
    iVar21 = Stream->ReaderCount;
    local_70 = ppvVar13;
    pvStack_80 = malloc((long)iVar21 << 2);
    local_98 = CONCAT44(local_98._4_4_,iVar21);
    iVar21 = Stream->ReaderCount;
    if (0 < (long)iVar21) {
      pp_Var5 = Stream->Readers;
      lVar25 = 0;
      do {
        *(StreamStatus *)((long)pvStack_80 + lVar25 * 4) = pp_Var5[lVar25]->ReaderStatus;
        lVar25 = lVar25 + 1;
      } while (iVar21 != lVar25);
    }
    pFVar14 = (FFSFormatList)0x0;
    Stream->ReleaseCount = 0;
    Stream->ReleaseList = (_ReleaseRec *)0x0;
    Stream->LockDefnsCount = 0;
    Stream->LockDefnsList = (_ReleaseRec *)0x0;
    iVar21 = Stream->CohortSize;
    lVar25 = (long)iVar21;
    uStack_d0 = CONCAT44(uStack_d0._4_4_,iVar21);
    local_d8 = Stream->WriterTimestep;
    p_Stack_c0 = (_SstData *)malloc(lVar25 << 4);
    local_b8 = (_SstData *)malloc(lVar25 << 4);
    pvStack_b0 = malloc(lVar25 * 8);
    ppvVar13 = local_70;
    iVar20 = 0;
    if (0 < lVar25) {
      lVar25 = 0;
      lVar23 = 0;
      iVar20 = 0;
      pFVar14 = (FFSFormatList)0x0;
      do {
        puVar6 = *ppvVar13[lVar23];
        puVar15 = (undefined4 *)((long)&p_Stack_c0->DataSize + lVar25);
        if (puVar6 == (undefined4 *)0x0) {
          uVar26 = 0;
          uVar27 = 0;
          uVar28 = 0;
          uVar29 = 0;
        }
        else {
          uVar26 = *puVar6;
          uVar27 = puVar6[1];
          uVar28 = puVar6[2];
          uVar29 = puVar6[3];
        }
        *puVar15 = uVar26;
        puVar15[1] = uVar27;
        puVar15[2] = uVar28;
        puVar15[3] = uVar29;
        puVar6 = *(undefined4 **)((long)ppvVar13[lVar23] + 8);
        puVar15 = (undefined4 *)((long)&local_b8->DataSize + lVar25);
        if (puVar6 == (undefined4 *)0x0) {
          uVar26 = 0;
          uVar27 = 0;
          uVar28 = 0;
          uVar29 = 0;
        }
        else {
          uVar26 = *puVar6;
          uVar27 = puVar6[1];
          uVar28 = puVar6[2];
          uVar29 = puVar6[3];
        }
        *puVar15 = uVar26;
        puVar15[1] = uVar27;
        puVar15[2] = uVar28;
        puVar15[3] = uVar29;
        *(undefined8 *)((long)pvStack_b0 + lVar23 * 8) =
             *(undefined8 *)((long)ppvVar13[lVar23] + 0x18);
        iVar20 = iVar20 + (uint)(*(long *)((long)ppvVar13[lVar23] + 0x18) == 0);
        pFVar14 = AddUniqueFormats(pFVar14,*(FFSFormatList *)((long)ppvVar13[lVar23] + 0x10),0);
        lVar23 = lVar23 + 1;
        iVar21 = Stream->CohortSize;
        lVar25 = lVar25 + 0x10;
      } while (lVar23 < iVar21);
    }
    if (iVar20 == iVar21) {
      free(pvStack_b0);
      pvStack_b0 = (void *)0x0;
    }
    ppvVar13 = local_70;
    if (Stream->AssembleMetadataUpcall == (AssembleMetadataUpcallFunc)0x0) {
      pvVar16 = (void *)0x0;
    }
    else {
      pvVar16 = (*Stream->AssembleMetadataUpcall)
                          (Stream->UpcallWriter,Stream->CohortSize,p_Stack_c0,local_b8);
      iVar21 = Stream->CohortSize;
      if (1 < (long)iVar21) {
        lVar25 = 0x10;
        do {
          puVar3 = (undefined8 *)((long)&p_Stack_c0->DataSize + lVar25);
          *puVar3 = 0;
          puVar3[1] = 0;
          puVar3 = (undefined8 *)((long)&local_b8->DataSize + lVar25);
          *puVar3 = 0;
          puVar3[1] = 0;
          lVar25 = lVar25 + 0x10;
        } while ((long)iVar21 * 0x10 != lVar25);
      }
    }
    free(ppvVar13);
    pFVar14 = AddUniqueFormats(Stream->PreviousFormats,pFVar14,1);
    Stream->PreviousFormats = pFVar14;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    Metadata = (ReturnMetadataInfo)
               CP_distributeDataFromRankZero
                         (Stream,&local_e8,Stream->CPInfo->ReturnMetadataInfoFormat,&local_60);
    if (Stream->FreeMetadataUpcall != (FreeMetadataUpcallFunc)0x0) {
      (*Stream->FreeMetadataUpcall)
                (Stream->UpcallWriter,RS_StreamPtr->Metadata,RS_StreamPtr->AttributeData,pvVar16);
    }
    free(pvStack_80);
    if (p_Stack_a0 != (_ReleaseRec *)0x0) {
      free(p_Stack_a0);
    }
    if (p_Stack_90 != (_ReleaseRec *)0x0) {
      free(p_Stack_90);
    }
    free(p_Stack_c0);
    free(local_b8);
  }
  else {
    Metadata = (ReturnMetadataInfo)
               CP_distributeDataFromRankZero
                         (Stream,(void *)0x0,Stream->CPInfo->ReturnMetadataInfoFormat,&local_60);
    pFVar14 = AddUniqueFormats(Stream->PreviousFormats,(Metadata->Msg).Formats,1);
    Stream->PreviousFormats = pFVar14;
  }
  free(local_58);
  iVar21 = Metadata->PendingReaderCount;
  RS_StreamPtr->DP_TimestepInfo = (Metadata->Msg).DP_TimestepInfo;
  p_Var9 = (Metadata->Msg).AttributeData;
  RS_StreamPtr->Metadata = (Metadata->Msg).Metadata;
  RS_StreamPtr->AttributeData = p_Var9;
  SVar10 = (Metadata->Msg).PreloadMode;
  pFVar14 = (Metadata->Msg).Formats;
  RS_StreamPtr->CohortSize = (Metadata->Msg).CohortSize;
  RS_StreamPtr->PreloadMode = SVar10;
  RS_StreamPtr->Formats = pFVar14;
  uVar26 = *(undefined4 *)((long)&(Metadata->Msg).RS_Stream + 4);
  sVar11 = (Metadata->Msg).Timestep;
  uVar27 = *(undefined4 *)((long)&(Metadata->Msg).Timestep + 4);
  *(undefined4 *)&RS_StreamPtr->RS_Stream = *(undefined4 *)&(Metadata->Msg).RS_Stream;
  *(undefined4 *)((long)&RS_StreamPtr->RS_Stream + 4) = uVar26;
  *(int *)&RS_StreamPtr->Timestep = (int)sVar11;
  *(undefined4 *)((long)&RS_StreamPtr->Timestep + 4) = uVar27;
  RS_StreamPtr->CohortSize = Stream->CohortSize;
  RS_StreamPtr->Timestep = Timestep;
  if (_perfstubs_initialized == 1) {
    ps_timer_stop_(SstInternalProvideTimestep::timerMD);
  }
  Entry->Msg = RS_StreamPtr;
  Entry->MetadataArray = RS_StreamPtr->Metadata;
  Entry->DP_TimestepInfo = RS_StreamPtr->DP_TimestepInfo;
  Entry->DataBlockToFree = local_60;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (0 < Metadata->ReaderCount) {
    uVar24 = 0;
    do {
      SVar4 = Stream->Readers[uVar24]->ReaderStatus;
      if (SVar4 != Metadata->ReaderStatus[uVar24]) {
        CP_verbose(Stream,PerRankVerbose,"Adjusting reader %d status from %s to %s\n",
                   uVar24 & 0xffffffff,SSTStreamStatusStr[SVar4],
                   SSTStreamStatusStr[Metadata->ReaderStatus[uVar24]]);
        CP_PeerFailCloseWSReader(Stream->Readers[uVar24],Metadata->ReaderStatus[uVar24]);
      }
      uVar24 = uVar24 + 1;
    } while ((long)uVar24 < (long)Metadata->ReaderCount);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (0 < Metadata->LockDefnsCount) {
    lVar25 = 0;
    do {
      uVar19 = Stream->ReaderCount;
      if ((int)uVar19 < 1) {
        uVar24 = 0;
      }
      else {
        uVar18 = 0;
        do {
          uVar24 = uVar18;
          if (Stream->Readers[uVar18]->RankZeroID == Metadata->LockDefnsList[lVar25].Reader) break;
          uVar18 = uVar18 + 1;
          uVar24 = (ulong)uVar19;
        } while (uVar19 != uVar18);
        uVar24 = uVar24 & 0xffffffff;
      }
      Stream->Readers[uVar24]->FullCommPatternLocked = 1;
      CP_verbose(Stream,TraceVerbose,"LockDefns List, FOUND TS %zd\n",
                 Metadata->LockDefnsList[lVar25].Timestep);
      lVar25 = lVar25 + 1;
    } while (lVar25 < Metadata->LockDefnsCount);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if ((Stream->ConfigParams->CPCommPattern == 0) && (Stream->Rank != 0)) {
    ProcessReleaseList(Stream,Metadata);
  }
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (0 < Stream->ReaderCount) {
    uVar24 = 0;
    iVar20 = 0;
    do {
      p_Var17 = Stream->Readers[uVar24];
      if ((p_Var17->FullCommPatternLocked != 0) && (p_Var17->CommPatternLockTimestep == -1)) {
        local_e8 = 0;
        sStack_e0 = 0;
        p_Var17 = Stream->Readers[uVar24];
        p_Var17->CommPatternLockTimestep = Timestep;
        p_Var7 = Stream->DP_Interface->WSRreadPatternLocked;
        if (p_Var7 != (CP_DP_WSR_ReadPatternLockedFunc)0x0) {
          (*p_Var7)(&Svcs,p_Var17->DP_WSR_Stream,Timestep);
        }
        iVar20 = iVar20 + 1;
        sStack_e0 = Timestep;
        sendOneToWSRCohort(Stream->Readers[uVar24],Stream->CPInfo->SharedCM->CommPatternLockedFormat
                           ,&local_e8,(void **)&local_e8);
        p_Var17 = Stream->Readers[uVar24];
        p_Var17->PreloadMode = SstPreloadLearned;
        p_Var17->PreloadModeActiveTimestep = Timestep;
        CP_verbose(Stream,PerStepVerbose,
                   "Setting preload mode Learned for reader %d, active at timestep %zd\n",
                   uVar24 & 0xffffffff,Timestep);
      }
      uVar24 = uVar24 + 1;
    } while ((long)uVar24 < (long)Stream->ReaderCount);
    if (iVar20 != 0) {
      CP_verbose(Stream,TraceVerbose,"Doing a barrier after notifying DP of preload mode changes\n")
      ;
      SMPI_Barrier(Stream->mpiComm);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (_perfstubs_initialized == 1) {
    if (SstInternalProvideTimestep::timerTS == (void *)0x0) {
      SstInternalProvideTimestep::timerTS = (void *)ps_timer_create_("provide timestep operations");
    }
    ps_timer_start_(SstInternalProvideTimestep::timerTS);
  }
  if (Metadata->DiscardThisTimestep != 0) {
    RS_StreamPtr->Metadata = (SstData)0x0;
    RS_StreamPtr->DP_TimestepInfo = (void **)0x0;
    CP_verbose(Stream,PerStepVerbose,
               "Sending Empty TimestepMetadata for Discarded timestep %ld, one to each reader\n",
               Timestep);
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    sendOneToEachReaderRank
              (Stream,Stream->CPInfo->SharedCM->DeliverTimestepMetadataFormat,RS_StreamPtr,
               (void **)RS_StreamPtr);
    Entry->Expired = 1;
    Entry->ReferenceCount = 0;
    goto LAB_00111dac;
  }
  CP_verbose(Stream,PerStepVerbose,
             "Sending TimestepMetadata for timestep %ld (ref count %d), one to each reader\n",
             Timestep,(ulong)(uint)Entry->ReferenceCount);
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  iVar20 = (int)extraout_RDX;
  sVar8 = Stream->ConfigParams->StepDistributionMode;
  p_Var17 = extraout_RDX;
  if (sVar8 == 2) {
LAB_00111d2a:
    iVar20 = (int)p_Var17;
    if (Stream->ReaderCount != 0) {
      do {
        iVar20 = (int)p_Var17;
        __ptr = Stream->StepRequestQueue;
        if (__ptr == (StepRequest)0x0) goto LAB_00111d99;
        Stream->StepRequestQueue = __ptr->Next;
        iVar20 = __ptr->RequestingReader;
        free(__ptr);
        p_Var17 = Stream->Readers[iVar20];
      } while (p_Var17->ReaderStatus != Established);
      Stream->LastDemandTimestep = Entry->Timestep;
      SendTimestepEntryToSingleReader(Stream,Entry,p_Var17,iVar20);
      iVar20 = extraout_EDX_00;
      if ((Stream->CloseTimestepCount != 0xffffffffffffffff) &&
         (Stream->LastDemandTimestep == Stream->CloseTimestepCount)) {
        SendCloseMsgs(Stream);
        iVar20 = extraout_EDX_01;
      }
    }
  }
  else if (sVar8 == 1) {
    if ((long)Stream->ReaderCount != 0) {
      if ((ulong)(long)Stream->ReaderCount <= Stream->NextRRDistribution) {
        Stream->NextRRDistribution = 0;
      }
      CP_verbose(Stream,PerRankVerbose,"Round Robin Distribution, step sent to reader %ld\n",
                 Stream->NextRRDistribution);
      SendTimestepEntryToSingleReader
                (Stream,Entry,Stream->Readers[Stream->NextRRDistribution],
                 (int)Stream->NextRRDistribution);
      Stream->NextRRDistribution = Stream->NextRRDistribution + 1;
      p_Var17 = extraout_RDX_00;
      goto LAB_00111d2a;
    }
  }
  else if ((sVar8 == 0) && (0 < Stream->ReaderCount)) {
    lVar25 = 0;
    do {
      SendTimestepEntryToSingleReader(Stream,Entry,Stream->Readers[lVar25],(int)lVar25);
      lVar25 = lVar25 + 1;
      iVar20 = extraout_EDX;
    } while (lVar25 < Stream->ReaderCount);
  }
LAB_00111d99:
  Entry->InProgressFlag = 0;
  SubRefTimestep(Stream,Entry->Timestep,iVar20);
LAB_00111dac:
  QueueMaintenance(Stream);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  iVar21 = iVar21 + 1;
  do {
    iVar21 = iVar21 + -1;
    if (iVar21 == 0) break;
    if (Stream->Rank == 0) {
      CP_verbose(Stream,SummaryVerbose,"Writer side ReaderLateArrival accepting incoming reader\n");
    }
    p_Var17 = WriterParticipateInReaderOpen(Stream);
    if (p_Var17 == (WS_ReaderInfo)0x0) {
      CP_error(Stream,"Potential reader registration failed\n");
    }
    else if (Stream->ConfigParams->CPCommPattern == 1) {
      waitForReaderResponseAndSendQueued(p_Var17);
    }
    else if (Stream->Rank == 0) {
      waitForReaderResponseAndSendQueued(p_Var17);
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      local_e8 = CONCAT44(local_e8._4_4_,p_Var17->ReaderStatus);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      SMPI_Bcast(&local_e8,1,SMPI_INT,0,Stream->mpiComm);
    }
    else {
      SMPI_Bcast(&local_e8,1,SMPI_INT,0,Stream->mpiComm);
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      p_Var17->ReaderStatus = (StreamStatus)local_e8;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
  } while (p_Var17 != (WS_ReaderInfo)0x0);
  if (_perfstubs_initialized == 1) {
    ps_timer_stop_(SstInternalProvideTimestep::timerTS);
  }
  return;
}

Assistant:

extern void SstInternalProvideTimestep(SstStream Stream, SstData LocalMetadata, SstData Data,
                                       ssize_t Timestep, FFSFormatList Formats,
                                       DataFreeFunc FreeTimestep, void *FreeClientData,
                                       SstData AttributeData, DataFreeFunc FreeAttributeData,
                                       void *FreeAttributelientData)
{
    void *data_block1, *data_block2;
    MetadataPlusDPInfo *pointers;
    ReturnMetadataInfo ReturnData;
    struct _TimestepMetadataMsg *Msg = malloc(sizeof(*Msg));
    void *DP_TimestepInfo = NULL;
    struct _MetadataPlusDPInfo Md;
    CPTimestepList Entry = calloc(1, sizeof(struct _CPTimestepEntry));
    int PendingReaderCount = 0;

    memset(Msg, 0, sizeof(*Msg));
    STREAM_MUTEX_LOCK(Stream);
    Stream->WriterTimestep = Timestep;

    STREAM_MUTEX_UNLOCK(Stream);
    Stream->DP_Interface->provideTimestep(&Svcs, Stream->DP_Stream, Data, LocalMetadata, Timestep,
                                          &DP_TimestepInfo);
    if (Formats)
    {
        FFSFormatList tmp = Formats;
        while (tmp)
        {
            tmp = tmp->Next;
        }
    }
    STREAM_MUTEX_LOCK(Stream);

    /* Md is the local contribution to MetaData */
    Md.Formats = Formats;
    Md.Metadata = (SstData)LocalMetadata;
    Md.AttributeData = (SstData)AttributeData;
    Md.DP_TimestepInfo = DP_TimestepInfo;

    if (Data)
    {
        PERFSTUBS_SAMPLE_COUNTER("Timestep local data size", Data->DataSize);
    }
    if (LocalMetadata)
    {
        PERFSTUBS_SAMPLE_COUNTER("Timestep local metadata size", LocalMetadata->DataSize);
    }

    /* preliminary queue of message before metadata collection.  Timestep may
     * still be discarded.*/

    Stream->LastProvidedTimestep = Timestep;
    if (Stream->ConfigParams->FirstTimestepPrecious && (Timestep == 0))
    {
        Entry->PreciousTimestep = 1;
    }
    Entry->ReferenceCount = 1; /* holding one for us, so it doesn't disappear under us */
    Entry->DPRegistered = 1;
    Entry->Timestep = Timestep;
    Entry->Msg = Msg;
    Entry->MetadataArray = Msg->Metadata;
    Entry->DP_TimestepInfo = Msg->DP_TimestepInfo;
    Entry->FreeTimestep = FreeTimestep;
    Entry->FreeClientData = FreeClientData;
    Entry->Next = Stream->QueuedTimesteps;
    Entry->InProgressFlag = 1;

    Stream->QueuedTimesteps = Entry;
    Stream->QueuedTimestepCount++;
    Stream->Stats.TimestepsCreated++;
    /* no one waits on timesteps being added, so no condition signal to note
     * change */

    STREAM_MUTEX_UNLOCK(Stream);

    PERFSTUBS_TIMER_START(timerMD, "Metadata Consolidation time in EndStep()");
    pointers = (MetadataPlusDPInfo *)CP_consolidateDataToRankZero(
        Stream, &Md, Stream->CPInfo->PerRankMetadataFormat, &data_block1);

    if (Stream->Rank == 0)
    {
        int DiscardThisTimestep = 0;
        struct _ReturnMetadataInfo TimestepMetaData;
        RegisterQueue ArrivingReader;
        void *MetadataFreeValue;
        STREAM_MUTEX_LOCK(Stream);
        ArrivingReader = Stream->ReaderRegisterQueue;
        QueueMaintenance(Stream);
        if (Stream->QueueFullPolicy == SstQueueFullDiscard)
        {
            CP_verbose(Stream, TraceVerbose,
                       "Testing Discard Condition, Queued Timestep Count %d, "
                       "QueueLimit %d\n",
                       Stream->QueuedTimestepCount, Stream->QueueLimit);
            QueueMaintenance(Stream);
            if (Stream->QueuedTimestepCount > Stream->QueueLimit)
            {
                DiscardThisTimestep = 1;
            }
        }
        else
        {
            while ((Stream->QueueLimit > 0) && (Stream->QueuedTimestepCount > Stream->QueueLimit))
            {
                CP_verbose(Stream, PerStepVerbose, "Blocking on QueueFull condition\n");
                STREAM_CONDITION_WAIT(Stream);
            }
        }
        memset(&TimestepMetaData, 0, sizeof(TimestepMetaData));
        TimestepMetaData.PendingReaderCount = 0;
        while (ArrivingReader)
        {
            TimestepMetaData.PendingReaderCount++;
            ArrivingReader = ArrivingReader->Next;
        }

        TimestepMetaData.DiscardThisTimestep = DiscardThisTimestep;
        TimestepMetaData.ReleaseCount = Stream->ReleaseCount;
        TimestepMetaData.ReleaseList = Stream->ReleaseList;
        TimestepMetaData.LockDefnsCount = Stream->LockDefnsCount;
        TimestepMetaData.LockDefnsList = Stream->LockDefnsList;
        TimestepMetaData.ReaderStatus = malloc(sizeof(enum StreamStatus) * Stream->ReaderCount);
        TimestepMetaData.ReaderCount = Stream->ReaderCount;
        for (int i = 0; i < Stream->ReaderCount; i++)
        {
            TimestepMetaData.ReaderStatus[i] = Stream->Readers[i]->ReaderStatus;
        }
        Stream->ReleaseCount = 0;
        Stream->ReleaseList = NULL;
        Stream->LockDefnsCount = 0;
        Stream->LockDefnsList = NULL;
        MetadataFreeValue = FillMetadataMsg(Stream, &TimestepMetaData.Msg, pointers);
        STREAM_MUTEX_UNLOCK(Stream);
        ReturnData = CP_distributeDataFromRankZero(
            Stream, &TimestepMetaData, Stream->CPInfo->ReturnMetadataInfoFormat, &data_block2);
        if (Stream->FreeMetadataUpcall)
        {
            Stream->FreeMetadataUpcall(Stream->UpcallWriter, Msg->Metadata, Msg->AttributeData,
                                       MetadataFreeValue);
        }
        free(TimestepMetaData.ReaderStatus);
        if (TimestepMetaData.ReleaseList)
            free(TimestepMetaData.ReleaseList);
        if (TimestepMetaData.LockDefnsList)
            free(TimestepMetaData.LockDefnsList);
        free(TimestepMetaData.Msg.Metadata);
        free(TimestepMetaData.Msg.AttributeData);
    }
    else
    {
        /* other ranks */
        ReturnData = CP_distributeDataFromRankZero(
            Stream, NULL, Stream->CPInfo->ReturnMetadataInfoFormat, &data_block2);
        Stream->PreviousFormats =
            AddUniqueFormats(Stream->PreviousFormats, ReturnData->Msg.Formats, /*copy*/ 1);
    }
    free(data_block1);
    PendingReaderCount = ReturnData->PendingReaderCount;
    *Msg = ReturnData->Msg;
    Msg->CohortSize = Stream->CohortSize;
    Msg->Timestep = Timestep;
    PERFSTUBS_TIMER_STOP(timerMD);

    /*
     * lock this Stream's data and queue the timestep
     */
    Entry->Msg = Msg;
    Entry->MetadataArray = Msg->Metadata;
    Entry->DP_TimestepInfo = Msg->DP_TimestepInfo;
    Entry->DataBlockToFree = data_block2;

    ProcessReaderStatusList(Stream, ReturnData);

    ProcessLockDefnsList(Stream, ReturnData);

    if ((Stream->ConfigParams->CPCommPattern == SstCPCommMin) && (Stream->Rank != 0))
    {
        ProcessReleaseList(Stream, ReturnData);
    }
    ActOnTSLockStatus(Stream, Timestep);
    PERFSTUBS_TIMER_START(timerTS, "provide timestep operations");
    if (ReturnData->DiscardThisTimestep)
    {
        /* Data was actually discarded, but we want to send a message to each
         * reader so that it knows a step was discarded, but actually so that we
         * get an error return if the write fails */

        Msg->Metadata = NULL;
        Msg->DP_TimestepInfo = NULL;

        CP_verbose(Stream, PerStepVerbose,
                   "Sending Empty TimestepMetadata for Discarded "
                   "timestep %ld, one to each reader\n",
                   Timestep);

        STREAM_MUTEX_LOCK(Stream);
        sendOneToEachReaderRank(Stream, Stream->CPInfo->SharedCM->DeliverTimestepMetadataFormat,
                                Msg, &Msg->RS_Stream);

        Entry->Expired = 1;
        Entry->ReferenceCount = 0;
        QueueMaintenance(Stream);
        STREAM_MUTEX_UNLOCK(Stream);
    }
    else
    {

        CP_verbose(Stream, PerStepVerbose,
                   "Sending TimestepMetadata for timestep %ld (ref count "
                   "%d), one to each reader\n",
                   Timestep, Entry->ReferenceCount);

        STREAM_MUTEX_LOCK(Stream);
        SendTimestepEntryToReaders(Stream, Entry);
        Entry->InProgressFlag = 0;
        SubRefTimestep(Stream, Entry->Timestep, 0);
        QueueMaintenance(Stream);
        STREAM_MUTEX_UNLOCK(Stream);
    }
    while (PendingReaderCount--)
    {
        WS_ReaderInfo reader;
        if (Stream->Rank == 0)
        {
            CP_verbose(Stream, SummaryVerbose,
                       "Writer side ReaderLateArrival accepting incoming reader\n");
        }
        reader = WriterParticipateInReaderOpen(Stream);
        if (!reader)
        {
            CP_error(Stream, "Potential reader registration failed\n");
            break;
        }
        if (Stream->ConfigParams->CPCommPattern == SstCPCommPeer)
        {
            waitForReaderResponseAndSendQueued(reader);
        }
        else
        {
            enum StreamStatus LocalStatus;
            if (Stream->Rank == 0)
            {
                waitForReaderResponseAndSendQueued(reader);
                STREAM_MUTEX_LOCK(Stream);
                LocalStatus = reader->ReaderStatus;
                STREAM_MUTEX_UNLOCK(Stream);
                SMPI_Bcast(&LocalStatus, 1, SMPI_INT, 0, Stream->mpiComm);
            }
            else
            {
                SMPI_Bcast(&LocalStatus, 1, SMPI_INT, 0, Stream->mpiComm);
                STREAM_MUTEX_LOCK(Stream);
                reader->ReaderStatus = LocalStatus;
                STREAM_MUTEX_UNLOCK(Stream);
            }
        }
    }
    PERFSTUBS_TIMER_STOP(timerTS);
}